

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

result<sockpp::none> * __thiscall
sockpp::socket::set_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t optlen)

{
  int ret;
  
  ret = setsockopt(this->handle_,level,optname,optval,optlen);
  check_res_none<int>(__return_storage_ptr__,ret);
  return __return_storage_ptr__;
}

Assistant:

result<> socket::set_option(
    int level, int optname, const void* optval, socklen_t optlen
) noexcept {
#if defined(_WIN32)
    return check_res_none(
        ::setsockopt(
            handle_, level, optname, static_cast<const char*>(optval),
            static_cast<int>(optlen)
        )
    );
#else
    return check_res_none(::setsockopt(handle_, level, optname, optval, optlen));
#endif
}